

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TagAlias::TagAlias(TagAlias *this,string *_tag,SourceLineInfo _lineInfo)

{
  string *_tag_local;
  TagAlias *this_local;
  SourceLineInfo _lineInfo_local;
  
  std::__cxx11::string::string((string *)this,_tag);
  (this->lineInfo).file = _lineInfo.file;
  (this->lineInfo).line = _lineInfo.line;
  return;
}

Assistant:

TagAlias::TagAlias(std::string const &_tag, SourceLineInfo _lineInfo)
      : tag(_tag)
      , lineInfo(_lineInfo) {
  }